

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FundamentalOperationalData.cpp
# Opt level: O1

KBOOL __thiscall
KDIS::DATA_TYPE::FundamentalOperationalData::operator==
          (FundamentalOperationalData *this,FundamentalOperationalData *Value)

{
  undefined1 auVar1 [16];
  
  auVar1[0] = -((Value->field_0).field_0.m_ui8SystemStatus ==
               (this->field_0).field_0.m_ui8SystemStatus);
  auVar1[1] = -((Value->field_0).field_0.m_ui8AltParam4 == (this->field_0).field_0.m_ui8AltParam4);
  auVar1[2] = -((Value->field_0).field_0.m_ui8InfoLayers == (this->field_0).field_0.m_ui8InfoLayers)
  ;
  auVar1[3] = -((Value->field_0).field_0.m_ui8Modifier == (this->field_0).field_0.m_ui8Modifier);
  auVar1[4] = -(*(char *)((long)&Value->field_0 + 4) == *(char *)((long)&this->field_0 + 4));
  auVar1[5] = -(*(char *)((long)&Value->field_0 + 5) == *(char *)((long)&this->field_0 + 5));
  auVar1[6] = -(*(char *)((long)&Value->field_0 + 6) == *(char *)((long)&this->field_0 + 6));
  auVar1[7] = -(*(char *)((long)&Value->field_0 + 7) == *(char *)((long)&this->field_0 + 7));
  auVar1[8] = -(*(char *)((long)&Value->field_0 + 8) == *(char *)((long)&this->field_0 + 8));
  auVar1[9] = -(*(char *)((long)&Value->field_0 + 9) == *(char *)((long)&this->field_0 + 9));
  auVar1[10] = -(*(char *)((long)&Value->field_0 + 10) == *(char *)((long)&this->field_0 + 10));
  auVar1[0xb] = -(*(char *)((long)&Value->field_0 + 0xb) == *(char *)((long)&this->field_0 + 0xb));
  auVar1[0xc] = -(*(char *)((long)&Value->field_0 + 0xc) == *(char *)((long)&this->field_0 + 0xc));
  auVar1[0xd] = -(*(char *)((long)&Value->field_0 + 0xd) == *(char *)((long)&this->field_0 + 0xd));
  auVar1[0xe] = -(*(char *)((long)&Value->field_0 + 0xe) == *(char *)((long)&this->field_0 + 0xe));
  auVar1[0xf] = -(*(char *)((long)&Value->field_0 + 0xf) == *(char *)((long)&this->field_0 + 0xf));
  return (ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe | (ushort)(auVar1[0xf] >> 7) << 0xf)
         == 0xffff;
}

Assistant:

KBOOL FundamentalOperationalData::operator == ( const FundamentalOperationalData & Value ) const
{
    if( m_ui8SystemStatus   != Value.m_ui8SystemStatus )    return false;
    if( m_ui8AltParam4      != Value.m_ui8AltParam4 )       return false;
    if( m_ui8InfoLayers     != Value.m_ui8InfoLayers )      return false;
    if( m_ui8Modifier       != Value.m_ui8Modifier )        return false;
    if( m_ui16Param1        != Value.m_ui16Param1 )         return false;
    if( m_ui16Param2        != Value.m_ui16Param2 )         return false;
    if( m_ui16Param3        != Value.m_ui16Param3 )         return false;
    if( m_ui16Param4        != Value.m_ui16Param4 )         return false;
    if( m_ui16Param5        != Value.m_ui16Param5 )         return false;
    if( m_ui16Param6        != Value.m_ui16Param6 )         return false;
    return true;
}